

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void __thiscall
Js::JavascriptArray::JavascriptArray
          (JavascriptArray *this,uint32 length,uint32 size,DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *recycler;
  SparseArraySegmentBase *segment;
  
  ArrayObject::ArrayObject(&this->super_ArrayObject,type,false,length);
  (this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01393b50;
  (this->head).ptr = (SparseArraySegmentBase *)0x0;
  if ((type->super_Type).typeId != TypeIds_Array) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x192,"(type->GetTypeId() == TypeIds_Array)",
                                "type->GetTypeId() == TypeIds_Array");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  DynamicObject::InitArrayFlags((DynamicObject *)this,InitialArrayValue);
  recycler = RecyclableObject::GetRecycler((RecyclableObject *)this);
  segment = &SparseArraySegment<void_*>::AllocateSegmentImpl<false>
                       (recycler,0,0,size,(SparseArraySegmentBase *)0x0)->
             super_SparseArraySegmentBase;
  SetHeadAndLastUsedSegment(this,segment);
  return;
}

Assistant:

JavascriptArray::JavascriptArray(uint32 length, uint32 size, DynamicType * type)
        : ArrayObject(type, false, length)
    {
        Assert(type->GetTypeId() == TypeIds_Array);
        InitArrayFlags(DynamicObjectFlags::InitialArrayValue);
        Recycler* recycler = GetRecycler();
        SetHeadAndLastUsedSegment(SparseArraySegment<Var>::AllocateSegment(recycler, 0, 0, size, nullptr));
    }